

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void CTcTokenizer::throw_internal_error(int errnum,...)

{
  char in_AL;
  __va_list_tag *in_R8;
  undefined8 in_R9;
  long in_XMM0_Qa;
  CTcTokFileDesc *in_XMM0_Qb;
  CTcMain *in_XMM1_Qa;
  va_list marker;
  long in_stack_ffffffffffffff58;
  CTcTokFileDesc *in_stack_ffffffffffffff60;
  CTcMain *in_stack_ffffffffffffff68;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff58 = in_XMM0_Qa;
    in_stack_ffffffffffffff60 = in_XMM0_Qb;
    in_stack_ffffffffffffff68 = in_XMM1_Qa;
  }
  get_last_desc(G_tok);
  get_last_linenum(G_tok);
  CTcMain::v_log_error
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             (tc_severity_t)((ulong)in_R9 >> 0x20),(int)in_R9,in_R8);
  err_throw(0);
}

Assistant:

NORETURN void CTcTokenizer::throw_internal_error(int errnum, ...)
{
    va_list marker;

    /* display the message */
    va_start(marker, errnum);
    G_tcmain->v_log_error(G_tok->get_last_desc(), G_tok->get_last_linenum(),
                          TC_SEV_INTERNAL, errnum, marker);
    va_end(marker);

    /* throw the generic internal error, since we've logged this */
    err_throw(TCERR_INTERNAL_ERROR);
}